

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,vector<int,_std::allocator<int>_> *target,
          string_view name,string_view value)

{
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar1;
  int *__x;
  _Optional_payload_base<int> local_3c;
  optional<int> result;
  vector<int,_std::allocator<int>_> *target_local;
  Option *this_local;
  string_view name_local;
  string *error;
  
  result.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload._M_value._3_1_ = 0;
  unique0x10000167 = target;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_3c = (_Optional_payload_base<int>)parseInt<int>(name,value,__return_storage_ptr__);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_3c);
  this_00 = stack0xffffffffffffffd0;
  if (bVar1) {
    __x = std::optional<int>::operator*((optional<int> *)&local_3c);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::vector<int32_t>& target, string_view name,
                                     string_view value) {
    std::string error;
    auto result = parseInt<int32_t>(name, value, error);
    if (result)
        target.push_back(*result);
    return error;
}